

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O2

CAmount wallet::CachedTxGetAvailableCredit(CWallet *wallet,CWalletTx *wtx,isminefilter *filter)

{
  long lVar1;
  pointer pCVar2;
  bool bVar3;
  bool bVar4;
  element_type *peVar5;
  CAmount CVar6;
  runtime_error *this;
  uint uVar7;
  ulong value;
  ulong uVar8;
  CTxOut *txout;
  long in_FS_OFFSET;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [32];
  uint32_t local_68;
  Txid hashTx;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = *filter;
  bVar3 = CWallet::IsTxImmatureCoinBase(wallet,wtx);
  if (bVar3) {
    value = 0;
  }
  else {
    uVar7 = uVar7 & 3;
    if (((uVar7 == 0) || (uVar7 == 3)) ||
       ((wtx->m_amounts[3].m_cached.super__Base_bitset<1UL>._M_w >> ((ulong)*filter & 0x3f) & 1) ==
        0)) {
      bVar3 = true;
      if ((*filter & 4) == 0) {
        bVar3 = CWallet::IsWalletFlagSet(wallet,1);
        bVar3 = !bVar3;
      }
      peVar5 = (wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(peVar5->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((long)(peVar5->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
      ;
      hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)
            ((long)(peVar5->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)
            ((long)(peVar5->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      value = 0;
      uVar8 = 0;
      while( true ) {
        pCVar2 = (peVar5->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)(((long)(peVar5->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)pCVar2) / 0x28) <=
            uVar8) break;
        local_88[0x10] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10];
        local_88[0x11] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11];
        local_88[0x12] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12];
        local_88[0x13] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13];
        local_88[0x14] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14];
        local_88[0x15] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15];
        local_88[0x16] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16];
        local_88[0x17] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17];
        local_88[0x18] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18];
        local_88[0x19] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19];
        local_88[0x1a] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a];
        local_88[0x1b] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b];
        local_88[0x1c] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c];
        local_88[0x1d] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d];
        local_88[0x1e] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e];
        local_88[0x1f] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f];
        local_88[0] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0];
        local_88[1] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[1];
        local_88[2] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[2];
        local_88[3] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[3];
        local_88[4] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[4];
        local_88[5] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[5];
        local_88[6] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[6];
        local_88[7] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[7];
        local_88[8] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[8];
        local_88[9] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[9];
        local_88[10] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[10];
        local_88[0xb] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb];
        local_88[0xc] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc];
        local_88[0xd] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd];
        local_88[0xe] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe];
        local_88[0xf] = hashTx.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf];
        local_68 = (uint32_t)uVar8;
        bVar4 = CWallet::IsSpent(wallet,(COutPoint *)local_88);
        if (!bVar4) {
          txout = pCVar2 + uVar8;
          if (!bVar3) {
            bVar4 = CWallet::IsSpentKey(wallet,&txout->scriptPubKey);
            if (bVar4) goto LAB_001cff7a;
          }
          CVar6 = OutputGetCredit(wallet,txout,filter);
          value = value + CVar6;
          if (2100000000000000 < value) {
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_a8,"CachedTxGetAvailableCredit",&local_a9);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88,&local_a8," : value out of range");
            std::runtime_error::runtime_error(this,(string *)local_88);
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_001d00a9;
          }
        }
LAB_001cff7a:
        uVar8 = (ulong)((uint32_t)uVar8 + 1);
        peVar5 = (wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
      }
      if ((uVar7 != 0) && (uVar7 != 3)) {
        CachableAmount::Set(wtx->m_amounts + 3,*filter,value);
        wtx->m_is_cache_empty = false;
      }
    }
    else {
      value = wtx->m_amounts[3].m_value[*filter];
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return value;
  }
LAB_001d00a9:
  __stack_chk_fail();
}

Assistant:

CAmount CachedTxGetAvailableCredit(const CWallet& wallet, const CWalletTx& wtx, const isminefilter& filter)
{
    AssertLockHeld(wallet.cs_wallet);

    // Avoid caching ismine for NO or ALL cases (could remove this check and simplify in the future).
    bool allow_cache = (filter & ISMINE_ALL) && (filter & ISMINE_ALL) != ISMINE_ALL;

    // Must wait until coinbase is safely deep enough in the chain before valuing it
    if (wallet.IsTxImmatureCoinBase(wtx))
        return 0;

    if (allow_cache && wtx.m_amounts[CWalletTx::AVAILABLE_CREDIT].m_cached[filter]) {
        return wtx.m_amounts[CWalletTx::AVAILABLE_CREDIT].m_value[filter];
    }

    bool allow_used_addresses = (filter & ISMINE_USED) || !wallet.IsWalletFlagSet(WALLET_FLAG_AVOID_REUSE);
    CAmount nCredit = 0;
    Txid hashTx = wtx.GetHash();
    for (unsigned int i = 0; i < wtx.tx->vout.size(); i++) {
        const CTxOut& txout = wtx.tx->vout[i];
        if (!wallet.IsSpent(COutPoint(hashTx, i)) && (allow_used_addresses || !wallet.IsSpentKey(txout.scriptPubKey))) {
            nCredit += OutputGetCredit(wallet, txout, filter);
            if (!MoneyRange(nCredit))
                throw std::runtime_error(std::string(__func__) + " : value out of range");
        }
    }

    if (allow_cache) {
        wtx.m_amounts[CWalletTx::AVAILABLE_CREDIT].Set(filter, nCredit);
        wtx.m_is_cache_empty = false;
    }

    return nCredit;
}